

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O1

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cppcms::triggers_recorder::detach_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,triggers_recorder *this)

{
  _Rb_tree_header *p_Var1;
  runtime_error *this_00;
  set<cppcms::triggers_recorder_*,_std::less<cppcms::triggers_recorder_*>,_std::allocator<cppcms::triggers_recorder_*>_>
  *this_01;
  pair<std::_Rb_tree_iterator<cppcms::triggers_recorder_*>,_std::_Rb_tree_iterator<cppcms::triggers_recorder_*>_>
  pVar2;
  undefined1 local_40 [32];
  
  if (this->cache_ != (cache_interface *)0x0) {
    this_01 = &this->cache_->recorders_;
    local_40._0_8_ = this;
    pVar2 = std::
            _Rb_tree<cppcms::triggers_recorder_*,_cppcms::triggers_recorder_*,_std::_Identity<cppcms::triggers_recorder_*>,_std::less<cppcms::triggers_recorder_*>,_std::allocator<cppcms::triggers_recorder_*>_>
            ::equal_range(&this_01->_M_t,(key_type *)local_40);
    std::
    _Rb_tree<cppcms::triggers_recorder_*,_cppcms::triggers_recorder_*,_std::_Identity<cppcms::triggers_recorder_*>,_std::less<cppcms::triggers_recorder_*>,_std::allocator<cppcms::triggers_recorder_*>_>
    ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
    this->cache_ = (cache_interface *)0x0;
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::swap(&__return_storage_ptr__->_M_t,&(this->triggers_)._M_t);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "triggers_recorder: the detach was called once, can\'t use the object twice","");
  booster::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00287810;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

std::set<std::string> triggers_recorder::detach()
{
	if(cache_) {
		cache_->remove_triggers_recorder(this);
		cache_ = 0;
	}
	else {
		throw cppcms_error("triggers_recorder: the detach was called once, can't use the object twice");
	}
	std::set<std::string> result;
	result.swap(triggers_);
	return result;
}